

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbuffer.cpp
# Opt level: O2

bool is_tracked_signal(QMetaMethod *signal)

{
  uint *puVar1;
  int iVar2;
  
  if (is_tracked_signal(QMetaMethod_const&)::sigs == '\0') {
    iVar2 = __cxa_guard_acquire(&is_tracked_signal(QMetaMethod_const&)::sigs);
    if (iVar2 != 0) {
      is_tracked_signal::sigs.readyReadSignal =
           QMetaMethod::fromSignal<void(QIODevice::*)()>((QMetaMethod *)QIODevice::readyRead,0);
      is_tracked_signal::sigs.bytesWrittenSignal =
           QMetaMethod::fromSignal<void(QIODevice::*)(long_long)>
                     ((QMetaMethod *)QIODevice::bytesWritten,0);
      __cxa_guard_release(&is_tracked_signal(QMetaMethod_const&)::sigs);
    }
  }
  puVar1 = (signal->data).d;
  return puVar1 == is_tracked_signal::sigs.bytesWrittenSignal.data.d ||
         puVar1 == is_tracked_signal::sigs.readyReadSignal.data.d;
}

Assistant:

static bool is_tracked_signal(const QMetaMethod &signal)
{
    // dynamic initialization: minimize the number of guard variables:
    static const struct {
        QMetaMethod readyReadSignal = QMetaMethod::fromSignal(&QBuffer::readyRead);
        QMetaMethod bytesWrittenSignal = QMetaMethod::fromSignal(&QBuffer::bytesWritten);
    } sigs;
    return signal == sigs.readyReadSignal || signal == sigs.bytesWrittenSignal;
}